

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *field)

{
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  iterator __position_03;
  ImportModuleField *pIVar1;
  iterator __position_04;
  long lVar2;
  ModuleFieldList *pMVar3;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  *p_Var4;
  int iVar5;
  Func *pFVar6;
  Import *import;
  Import *local_50;
  Func *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  int local_28;
  
  local_50 = *(Import **)
              ((field->_M_t).
               super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40);
  switch(*(undefined4 *)(local_50 + 0x48)) {
  case 0:
    pFVar6 = (Func *)(local_50 + 0x50);
    __position._M_current = *(Func ***)&this->field_0x90;
    iVar5 = (int)((ulong)((long)__position._M_current - *(long *)&this->funcs) >> 3);
    local_48 = pFVar6;
    if (__position._M_current == *(Func ***)&this->field_0x98) {
      std::vector<wabt::Func*,std::allocator<wabt::Func*>>::_M_realloc_insert<wabt::Func*>
                ((vector<wabt::Func*,std::allocator<wabt::Func*>> *)&this->funcs,__position,
                 &local_48);
    }
    else {
      *__position._M_current = pFVar6;
      *(long *)&this->field_0x90 = *(long *)&this->field_0x90 + 8;
    }
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->func_bindings;
    this->num_func_imports = this->num_func_imports + 1;
    break;
  case 1:
    pFVar6 = (Func *)(local_50 + 0x50);
    __position_03._M_current = *(Table ***)&this->field_0x108;
    iVar5 = (int)((ulong)((long)__position_03._M_current - *(long *)&this->tables) >> 3);
    local_48 = pFVar6;
    if (__position_03._M_current == *(Table ***)&this->field_0x110) {
      std::vector<wabt::Table*,std::allocator<wabt::Table*>>::_M_realloc_insert<wabt::Table*>
                ((vector<wabt::Table*,std::allocator<wabt::Table*>> *)&this->tables,__position_03,
                 (Table **)&local_48);
    }
    else {
      *__position_03._M_current = (Table *)pFVar6;
      *(long *)&this->field_0x108 = *(long *)&this->field_0x108 + 8;
    }
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->table_bindings;
    this->num_table_imports = this->num_table_imports + 1;
    break;
  case 2:
    pFVar6 = (Func *)(local_50 + 0x50);
    __position_01._M_current = *(Memory ***)&this->field_0x138;
    iVar5 = (int)((ulong)((long)__position_01._M_current - *(long *)&this->memories) >> 3);
    local_48 = pFVar6;
    if (__position_01._M_current == *(Memory ***)&this->field_0x140) {
      std::vector<wabt::Memory*,std::allocator<wabt::Memory*>>::_M_realloc_insert<wabt::Memory*>
                ((vector<wabt::Memory*,std::allocator<wabt::Memory*>> *)&this->memories,
                 __position_01,(Memory **)&local_48);
    }
    else {
      *__position_01._M_current = (Memory *)pFVar6;
      *(long *)&this->field_0x138 = *(long *)&this->field_0x138 + 8;
    }
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->memory_bindings;
    this->num_memory_imports = this->num_memory_imports + 1;
    break;
  case 3:
    pFVar6 = (Func *)(local_50 + 0x50);
    __position_02._M_current = *(Global ***)&this->field_0xa8;
    iVar5 = (int)((ulong)((long)__position_02._M_current - *(long *)&this->globals) >> 3);
    local_48 = pFVar6;
    if (__position_02._M_current == *(Global ***)&this->field_0xb0) {
      std::vector<wabt::Global*,std::allocator<wabt::Global*>>::_M_realloc_insert<wabt::Global*>
                ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,__position_02
                 ,(Global **)&local_48);
    }
    else {
      *__position_02._M_current = (Global *)pFVar6;
      *(long *)&this->field_0xa8 = *(long *)&this->field_0xa8 + 8;
    }
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->global_bindings;
    this->num_global_imports = this->num_global_imports + 1;
    break;
  case 4:
    pFVar6 = (Func *)(local_50 + 0x50);
    __position_00._M_current = *(Event ***)&this->field_0x78;
    iVar5 = (int)((ulong)((long)__position_00._M_current - *(long *)&this->events) >> 3);
    local_48 = pFVar6;
    if (__position_00._M_current == *(Event ***)&this->field_0x80) {
      std::vector<wabt::Event*,std::allocator<wabt::Event*>>::_M_realloc_insert<wabt::Event*>
                ((vector<wabt::Event*,std::allocator<wabt::Event*>> *)&this->events,__position_00,
                 (Event **)&local_48);
    }
    else {
      *__position_00._M_current = (Event *)pFVar6;
      *(long *)&this->field_0x78 = *(long *)&this->field_0x78 + 8;
    }
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->event_bindings;
    this->num_event_imports = this->num_event_imports + 1;
    break;
  default:
    iVar5 = -1;
    p_Var4 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)0x0;
    pFVar6 = (Func *)0x0;
  }
  if (((iVar5 != -1) && (pFVar6 != (Func *)0x0)) &&
     (p_Var4 != (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                 *)0x0)) {
    if (*(long *)(pFVar6 + 8) != 0) {
      pIVar1 = (field->_M_t).
               super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
               .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
      local_48 = *(Func **)(pIVar1 + 0x18);
      uStack_40 = *(undefined4 *)(pIVar1 + 0x20);
      uStack_3c = *(undefined4 *)(pIVar1 + 0x24);
      local_38 = *(undefined4 *)(pIVar1 + 0x28);
      uStack_34 = *(undefined4 *)(pIVar1 + 0x2c);
      uStack_30 = *(undefined4 *)(pIVar1 + 0x30);
      uStack_2c = *(undefined4 *)(pIVar1 + 0x34);
      local_28 = iVar5;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string_const&,wabt::Binding>(p_Var4,0,pFVar6);
    }
    __position_04._M_current = *(Import ***)&this->field_0xc0;
    if (__position_04._M_current == *(Import ***)&this->field_0xc8) {
      std::vector<wabt::Import*,std::allocator<wabt::Import*>>::
      _M_realloc_insert<wabt::Import*const&>
                ((vector<wabt::Import*,std::allocator<wabt::Import*>> *)&this->imports,__position_04
                 ,&local_50);
    }
    else {
      *__position_04._M_current = local_50;
      *(long *)&this->field_0xc0 = *(long *)&this->field_0xc0 + 8;
    }
    pIVar1 = (field->_M_t).
             super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl;
    (field->_M_t).
    super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
    .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl = (ImportModuleField *)0x0
    ;
    if ((*(long *)(pIVar1 + 0x10) == 0) && (*(long *)(pIVar1 + 8) == 0)) {
      lVar2 = *(long *)&this->field_0x48;
      if (lVar2 == 0) {
        pMVar3 = &this->fields;
      }
      else {
        *(long *)(pIVar1 + 0x10) = lVar2;
        pMVar3 = (ModuleFieldList *)(lVar2 + 8);
      }
      *(ImportModuleField **)pMVar3 = pIVar1;
      *(ImportModuleField **)&this->field_0x48 = pIVar1;
      *(long *)&this->field_0x50 = *(long *)&this->field_0x50 + 1;
      return;
    }
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                  ,0x1bf,
                  "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                 );
  }
  __assert_fail("name && bindings && index != kInvalidIndex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir.cc",
                0x1cd,"void wabt::Module::AppendField(std::unique_ptr<ImportModuleField>)");
}

Assistant:

void Module::AppendField(std::unique_ptr<ImportModuleField> field) {
  Import* import = field->import.get();
  const std::string* name = nullptr;
  BindingHash* bindings = nullptr;
  Index index = kInvalidIndex;

  switch (import->kind()) {
    case ExternalKind::Func: {
      Func& func = cast<FuncImport>(import)->func;
      name = &func.name;
      bindings = &func_bindings;
      index = funcs.size();
      funcs.push_back(&func);
      ++num_func_imports;
      break;
    }

    case ExternalKind::Table: {
      Table& table = cast<TableImport>(import)->table;
      name = &table.name;
      bindings = &table_bindings;
      index = tables.size();
      tables.push_back(&table);
      ++num_table_imports;
      break;
    }

    case ExternalKind::Memory: {
      Memory& memory = cast<MemoryImport>(import)->memory;
      name = &memory.name;
      bindings = &memory_bindings;
      index = memories.size();
      memories.push_back(&memory);
      ++num_memory_imports;
      break;
    }

    case ExternalKind::Global: {
      Global& global = cast<GlobalImport>(import)->global;
      name = &global.name;
      bindings = &global_bindings;
      index = globals.size();
      globals.push_back(&global);
      ++num_global_imports;
      break;
    }

    case ExternalKind::Event: {
      Event& event = cast<EventImport>(import)->event;
      name = &event.name;
      bindings = &event_bindings;
      index = events.size();
      events.push_back(&event);
      ++num_event_imports;
      break;
    }
  }

  assert(name && bindings && index != kInvalidIndex);
  if (!name->empty()) {
    bindings->emplace(*name, Binding(field->loc, index));
  }
  imports.push_back(import);
  fields.push_back(std::move(field));
}